

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

void Allocations::validateOverlap(void)

{
  bool bVar1;
  reference __src;
  long lVar2;
  int64_t iVar3;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  Key key;
  Key key_00;
  int64_t newUsageEnd;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  iterator __end1;
  iterator __begin1;
  map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
  *__range1;
  Usage lastUsage;
  int64_t lastEndPosition;
  Key lastKey;
  
  lastEndPosition = -1;
  lastKey.fileID = -1;
  lastUsage.usesFill = true;
  lastUsage.shared = true;
  lastUsage._18_6_ = 0xffffffffffff;
  memset(&__range1,0,0x18);
  __end1 = std::
           map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
           ::begin(&allocations);
  it.second._16_8_ =
       std::
       map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
       ::end(&allocations);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it.second.usesFill);
    if (!bVar1) {
      return;
    }
    __src = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::
            operator*(&__end1);
    memcpy(&newUsageEnd,__src,0x28);
    iVar3 = extraout_RDX;
    if (((newUsageEnd == lastEndPosition) && (lastKey.fileID < it.first.fileID)) &&
       (it.first.fileID < (long)lastUsage._16_8_)) {
      if (it.first.fileID < lastKey.fileID + lastUsage.space) {
        Logger::queueError<long,long>
                  (Warning,"Content of areas %08llX and %08llx overlap",&lastKey.fileID,(long *)&it)
        ;
        iVar3 = extraout_RDX_00;
      }
      else if ((((byte)it.second.usage & 1) != 0) && ((lastUsage.usage & 1U) != 0)) {
        Logger::queueError<long,long>
                  (Warning,"Areas %08llX and %08llx overlap and both fill",&lastKey.fileID,
                   (long *)&it);
        iVar3 = extraout_RDX_01;
      }
      if ((long)lastUsage._16_8_ <= it.first.fileID + it.first.position) goto LAB_001f98ff;
      lVar2 = it.first.fileID + it.second.space;
      key.position = iVar3;
      key.fileID = it.first.fileID;
      iVar3 = getSubAreaUsage((Allocations *)newUsageEnd,key);
      lastUsage.space = (lVar2 + iVar3) - lastKey.fileID;
    }
    else {
LAB_001f98ff:
      lastEndPosition = newUsageEnd;
      lastKey.fileID = it.first.fileID;
      __range1 = (map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
                  *)it.first.position;
      lastUsage.space = it.second.space;
      lastUsage.usage = (int64_t)(byte)it.second.usage;
      key_00.position = iVar3;
      key_00.fileID = it.first.fileID;
      iVar3 = getSubAreaUsage((Allocations *)newUsageEnd,key_00);
      lastUsage.space = iVar3 + lastUsage.space;
      lastUsage._16_8_ = it.first.fileID + it.first.position;
    }
    std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

void Allocations::validateOverlap()
{
	// An easy mistake to make is a "subarea" where the parent area fills, and erases the subarea.
	// Let's detect any sort of area overlap and report a warning.
	Key lastKey{ -1, -1 };
	int64_t lastEndPosition = -1;
	Usage lastUsage{};

	for (auto it : allocations) {
		if (it.first.fileID == lastKey.fileID && it.first.position > lastKey.position && it.first.position < lastEndPosition) {
			// First, the obvious: does the content overlap?
			if (it.first.position < lastKey.position + lastUsage.usage)
				Logger::queueError(Logger::Warning, "Content of areas %08llX and %08llx overlap", lastKey.position, it.first.position);
			// Next question, does the earlier one fill?
			else if (it.second.usesFill && lastUsage.usesFill)
				Logger::queueError(Logger::Warning, "Areas %08llX and %08llx overlap and both fill", lastKey.position, it.first.position);

			// If the new area ends before the last, keep it as the last.
			if (lastEndPosition > it.first.position + it.second.space) {
				// But update the usage to the max position.
				int64_t newUsageEnd = it.first.position + it.second.usage + getSubAreaUsage(it.first);
				lastUsage.usage = newUsageEnd - lastKey.position;
				continue;
			}
		}

		lastKey = it.first;
		lastUsage = it.second;
		lastUsage.usage += getSubAreaUsage(lastKey);
		lastEndPosition = it.first.position + it.second.space;
	}
}